

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_data.c
# Opt level: O0

int cmd_data_opt(yl_opt *yo,char *cmdline,char ***posv,int *posc)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  undefined1 local_1e8 [7];
  uint8_t data_type_set;
  option options [13];
  undefined1 local_40 [4];
  int local_3c;
  int opt_index;
  int opt;
  int argc;
  int rc;
  int *posc_local;
  char ***posv_local;
  char *cmdline_local;
  yl_opt *yo_local;
  
  opt = 0;
  opt_index = 0;
  _argc = posc;
  posc_local = (int *)posv;
  posv_local = (char ***)cmdline;
  cmdline_local = (char *)yo;
  memcpy(local_1e8,&PTR_anon_var_dwarf_6c95_0011b4a0,0x1a0);
  bVar1 = false;
  cmdline_local[0x90] = '\0';
  cmdline_local[0x91] = '\0';
  cmdline_local[0x92] = '\x02';
  cmdline_local[0x93] = '\0';
  cmdline_local[0x94] = '\x04';
  cmdline_local[0x95] = '\0';
  cmdline_local[0x96] = '\0';
  cmdline_local[0x97] = '\0';
  opt = parse_cmdline((char *)posv_local,&opt_index,(char ***)(cmdline_local + 0xf8));
  if (opt != 0) {
    return opt;
  }
  do {
    local_3c = getopt_long(opt_index,*(undefined8 *)(cmdline_local + 0xf8),commands[4].optstring,
                           local_1e8,local_40);
    if (local_3c == -1) {
      *(long *)posc_local = *(long *)(cmdline_local + 0xf8) + (long)_optind * 8;
      *_argc = opt_index - _optind;
      return opt;
    }
    switch(local_3c) {
    case 0x46:
      iVar3 = yo_opt_update_data_in_format(_optarg,(yl_opt *)cmdline_local);
      if (iVar3 != 0) {
        yl_log('\x01',"Unknown input format %s.",_optarg);
        cmd_data_help_in_format();
        return 1;
      }
      break;
    default:
      yl_log('\x01',"Unknown option.");
      return 1;
    case 0x4f:
      if (*(long *)(cmdline_local + 0xc0) != 0) {
        yl_log('\x01',"The operational datastore (-O) cannot be set multiple times.");
        return 1;
      }
      *(char **)(cmdline_local + 0xc0) = _optarg;
      break;
    case 0x52:
      if (*(long *)(cmdline_local + 0xd8) != 0) {
        yl_log('\x01',"The PRC of the reply (-R) cannot be set multiple times.");
        return 1;
      }
      *(char **)(cmdline_local + 0xd8) = _optarg;
      break;
    case 100:
      iVar3 = yo_opt_update_data_default(_optarg,(yl_opt *)cmdline_local);
      if (iVar3 != 0) {
        yl_log('\x01',"Unknown default mode %s.",_optarg);
        cmd_data_help_default();
        return 1;
      }
      break;
    case 0x65:
      *(uint *)(cmdline_local + 0x94) = *(uint *)(cmdline_local + 0x94) | 2;
      break;
    case 0x66:
      iVar3 = yl_opt_update_data_out_format(_optarg,(yl_opt *)cmdline_local);
      if (iVar3 != 0) {
        cmd_data_help_format();
        return 1;
      }
      break;
    case 0x68:
      cmd_data_help();
      return 1;
    case 0x6d:
      cmdline_local[0x9c] = '\x01';
      break;
    case 0x6e:
      *(uint *)(cmdline_local + 0x90) = *(uint *)(cmdline_local + 0x90) & 0xfffdffff;
      break;
    case 0x6f:
      if (*(long *)(cmdline_local + 0x18) != 0) {
        yl_log('\x01',"Only a single output can be specified.");
        return 1;
      }
      iVar3 = ly_out_new_filepath(_optarg,cmdline_local + 0x18);
      pcVar2 = _optarg;
      if (iVar3 != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        yl_log('\x01',"Unable open output file %s (%s).",pcVar2,pcVar5);
        return 1;
      }
      break;
    case 0x74:
      if (bVar1) {
        yl_log('\x01',"The data type (-t) cannot be set multiple times.");
        return 1;
      }
      iVar3 = yl_opt_update_data_type(_optarg,(yl_opt *)cmdline_local);
      if (iVar3 != 0) {
        yl_log('\x01',"Unknown data tree type %s.",_optarg);
        cmd_data_help_type();
        return 1;
      }
      bVar1 = true;
      break;
    case 0x78:
      iVar3 = ly_set_add(cmdline_local + 0xe8,_optarg,0,0);
      if (iVar3 != 0) {
        yl_log('\x01',"Storing XPath \"%s\" failed.",_optarg);
        return 1;
      }
    }
  } while( true );
}

Assistant:

int
cmd_data_opt(struct yl_opt *yo, const char *cmdline, char ***posv, int *posc)
{
    int rc = 0, argc = 0;
    int opt, opt_index;
    struct option options[] = {
        {"defaults",    required_argument, NULL, 'd'},
        {"present",     no_argument,       NULL, 'e'},
        {"format",      required_argument, NULL, 'f'},
        {"in-format",   required_argument, NULL, 'F'},
        {"help",        no_argument,       NULL, 'h'},
        {"merge",       no_argument,       NULL, 'm'},
        {"output",      required_argument, NULL, 'o'},
        {"operational", required_argument, NULL, 'O'},
        {"reply-rpc",   required_argument, NULL, 'R'},
        {"not-strict",  no_argument,       NULL, 'n'},
        {"type",        required_argument, NULL, 't'},
        {"xpath",       required_argument, NULL, 'x'},
        {NULL, 0, NULL, 0}
    };

    uint8_t data_type_set = 0;

    yo->data_parse_options = YL_DEFAULT_DATA_PARSE_OPTIONS;
    yo->data_validate_options = YL_DEFAULT_DATA_VALIDATE_OPTIONS;

    if ((rc = parse_cmdline(cmdline, &argc, &yo->argv))) {
        return rc;
    }

    while ((opt = getopt_long(argc, yo->argv, commands[CMD_DATA].optstring, options, &opt_index)) != -1) {
        switch (opt) {
        case 'd': /* --default */
            if (yo_opt_update_data_default(optarg, yo)) {
                YLMSG_E("Unknown default mode %s.", optarg);
                cmd_data_help_default();
                return 1;
            }
            break;
        case 'f': /* --format */
            if (yl_opt_update_data_out_format(optarg, yo)) {
                cmd_data_help_format();
                return 1;
            }
            break;
        case 'F': /* --in-format */
            if (yo_opt_update_data_in_format(optarg, yo)) {
                YLMSG_E("Unknown input format %s.", optarg);
                cmd_data_help_in_format();
                return 1;
            }
            break;
        case 'o': /* --output */
            if (yo->out) {
                YLMSG_E("Only a single output can be specified.");
                return 1;
            } else {
                if (ly_out_new_filepath(optarg, &yo->out)) {
                    YLMSG_E("Unable open output file %s (%s).", optarg, strerror(errno));
                    return 1;
                }
            }
            break;
        case 'O':   /* --operational */
            if (yo->data_operational.path) {
                YLMSG_E("The operational datastore (-O) cannot be set multiple times.");
                return 1;
            }
            yo->data_operational.path = optarg;
            break;
        case 'R':   /* --reply-rpc */
            if (yo->reply_rpc.path) {
                YLMSG_E("The PRC of the reply (-R) cannot be set multiple times.");
                return 1;
            }
            yo->reply_rpc.path = optarg;
            break;
        case 'e': /* --present */
            yo->data_validate_options |= LYD_VALIDATE_PRESENT;
            break;
        case 'm': /* --merge */
            yo->data_merge = 1;
            break;
        case 'n': /* --not-strict */
            yo->data_parse_options &= ~LYD_PARSE_STRICT;
            break;
        case 't': /* --type */
            if (data_type_set) {
                YLMSG_E("The data type (-t) cannot be set multiple times.");
                return 1;
            }

            if (yl_opt_update_data_type(optarg, yo)) {
                YLMSG_E("Unknown data tree type %s.", optarg);
                cmd_data_help_type();
                return 1;
            }

            data_type_set = 1;
            break;

        case 'x': /* --xpath */
            if (ly_set_add(&yo->data_xpath, optarg, 0, NULL)) {
                YLMSG_E("Storing XPath \"%s\" failed.", optarg);
                return 1;
            }
            break;

        case 'h': /* --help */
            cmd_data_help();
            return 1;
        default:
            YLMSG_E("Unknown option.");
            return 1;
        }
    }

    *posv = &yo->argv[optind];
    *posc = argc - optind;

    return rc;
}